

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 14_recursive_func.cpp
# Opt level: O0

void init_ruler(char *arr)

{
  int min;
  int max;
  int i;
  char *arr_local;
  
  for (min = 0; min < 0x3a; min = min + 1) {
    arr[min] = ' ';
  }
  arr[0x3b] = '\0';
  *arr = '|';
  arr[0x3a] = '|';
  return;
}

Assistant:

void init_ruler (char arr[]) {
    //  初始化
    int i = 0;
    for(i = 0; i < LENGTH - 2; i++) {
        arr[i] = ' ';
    }
    arr[LENGTH - 1] = '\0';

    int max = LENGTH - 2;
    int min = 0;
    arr[max] = arr[min] = '|';
}